

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

rnndelem * copydelem(rnndelem *elem,char *file)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  rnnaccess rVar4;
  rnndelem *prVar5;
  char *pcVar6;
  rnndelem **pprVar7;
  rnndelem *prVar8;
  int iVar9;
  long lVar10;
  
  prVar5 = (rnndelem *)calloc(0x110,1);
  prVar5->type = elem->type;
  pcVar6 = elem->name;
  prVar5->name = pcVar6;
  if (pcVar6 != (char *)0x0) {
    pcVar6 = strdup(pcVar6);
    prVar5->name = pcVar6;
  }
  rVar4 = elem->access;
  prVar5->width = elem->width;
  prVar5->access = rVar4;
  uVar3 = elem->length;
  prVar5->offset = elem->offset;
  prVar5->length = uVar3;
  prVar5->stride = elem->stride;
  copyvarinfo(&prVar5->varinfo,&elem->varinfo);
  prVar5->file = file;
  copytypeinfo(&prVar5->typeinfo,&elem->typeinfo,file);
  for (lVar10 = 0; lVar10 < elem->subelemsnum; lVar10 = lVar10 + 1) {
    iVar1 = prVar5->subelemsnum;
    iVar2 = prVar5->subelemsmax;
    if (iVar2 <= iVar1) {
      iVar9 = iVar2 * 2;
      if (iVar2 == 0) {
        iVar9 = 0x10;
      }
      prVar5->subelemsmax = iVar9;
      pprVar7 = (rnndelem **)realloc(prVar5->subelems,(long)iVar9 << 3);
      prVar5->subelems = pprVar7;
    }
    prVar8 = copydelem(elem->subelems[lVar10],file);
    prVar5->subelemsnum = iVar1 + 1;
    prVar5->subelems[iVar1] = prVar8;
  }
  return prVar5;
}

Assistant:

static struct rnndelem *copydelem (struct rnndelem *elem, char *file) {
	struct rnndelem *res = calloc (sizeof *res, 1);
	res->type = elem->type;
	res->name = elem->name;
	if (res->name)
		res->name = strdup(res->name);
	res->width = elem->width;
	res->access = elem->access;
	res->offset = elem->offset;
	res->length = elem->length;
	res->stride = elem->stride;
	copyvarinfo(&res->varinfo, &elem->varinfo);
	res->file = file;
	copytypeinfo(&res->typeinfo, &elem->typeinfo, file);
	int i;
	for (i = 0; i < elem->subelemsnum; i++)
		ADDARRAY(res->subelems, copydelem(elem->subelems[i], file));
	return res;
}